

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

Vec_Str_t *
Bmc_CollapseOneOld2(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Str_t *p_00;
  Gia_Obj_t *pGVar3;
  Vec_Str_t *p_01;
  Vec_Str_t *pVVar4;
  char Entry;
  ulong uVar5;
  
  iVar2 = nCubeLim;
  p_00 = Bmc_CollapseOneInt2(p,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose,0);
  if (p_00 == (Vec_Str_t *)0x0) {
    uVar1 = 1000000000;
  }
  else {
    uVar1 = Vec_StrCountEntry(p_00,(char)iVar2);
  }
  pGVar3 = Gia_ManPo(p,iVar2);
  Gia_ObjFlipFaninC0(pGVar3);
  if ((int)uVar1 <= nCubeLim) {
    nCubeLim = uVar1;
  }
  uVar5 = (ulong)(uint)nCubeLim;
  p_01 = Bmc_CollapseOneInt2(p,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose,1);
  pGVar3 = Gia_ManPo(p,(int)uVar5);
  Entry = (char)uVar5;
  Gia_ObjFlipFaninC0(pGVar3);
  pVVar4 = p_00;
  if ((p_01 != (Vec_Str_t *)0x0) &&
     (iVar2 = Vec_StrCountEntry(p_01,Entry), pVVar4 = p_01, p_00 != (Vec_Str_t *)0x0)) {
    pVVar4 = p_00;
    if (iVar2 < (int)uVar1) {
      pVVar4 = p_01;
      p_01 = p_00;
    }
    Vec_StrFree(p_01);
  }
  return pVVar4;
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld2( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    Vec_Str_t * vSopOn, * vSopOff;
    int nCubesOn = ABC_INFINITY;
    int nCubesOff = ABC_INFINITY;
    vSopOn = Bmc_CollapseOneInt2( p, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose, 0 );
    if ( vSopOn )
        nCubesOn = Vec_StrCountEntry(vSopOn,'\n');
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    vSopOff = Bmc_CollapseOneInt2( p, Abc_MinInt(nCubeLim, nCubesOn), nBTLimit, fCanon, fReverse, fVerbose, 1 );
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    if ( vSopOff )
        nCubesOff = Vec_StrCountEntry(vSopOff,'\n');
    if ( vSopOn == NULL )
        return vSopOff;
    if ( vSopOff == NULL )
        return vSopOn;
    if ( nCubesOn <= nCubesOff )
    {
        Vec_StrFree( vSopOff );
        return vSopOn;
    }
    else
    {
        Vec_StrFree( vSopOn );
        return vSopOff;
    }
}